

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

ModifiedRow * __thiscall
QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
          (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *this,int *key)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
  *pQVar2;
  Op OVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Rb_tree_iterator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_> _Var6;
  uint uVar7;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>,_bool>
  pVar8;
  QSqlRecord local_90;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
  local_88;
  Op local_80;
  QSqlRecord local_78;
  QSqlRecord QStack_70;
  undefined2 local_68;
  pair<const_int,_QSqlTableModelPrivate::ModifiedRow> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_88.d.ptr ==
       (QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
           *)local_88.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_88.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_*>
          )(QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
       *)local_88.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
                        *)local_88.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar2 = (this->d).d.ptr;
  p_Var5 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
    iVar4 = *key;
    _Var6._M_node = &p_Var1->_M_header;
    do {
      if (iVar4 <= (int)p_Var5[1]._M_color) {
        _Var6._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar4];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var6._M_node != p_Var1) && ((int)_Var6._M_node[1]._M_color <= iVar4))
    goto LAB_0013d8e8;
  }
  QSqlRecord::QSqlRecord(&local_90);
  local_80 = None;
  QSqlRecord::QSqlRecord(&local_78);
  QSqlRecord::QSqlRecord(&QStack_70,&local_90);
  local_68._0_1_ = true;
  local_68._1_1_ = false;
  if (local_80 != None) {
    local_80 = None;
    QSqlRecord::operator=(&local_78,&QStack_70);
    OVar3 = local_80;
    iVar4 = QSqlRecord::count(&local_78);
    if (0 < iVar4) {
      uVar7 = iVar4 + 1;
      do {
        QSqlRecord::setGenerated(&local_78,uVar7 - 2,OVar3 == Delete);
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
    }
  }
  local_60.second.m_db_values.d.d.ptr = QStack_70.d.d.ptr;
  local_60.second.m_rec.d.d.ptr = local_78.d.d.ptr;
  local_60.first = *key;
  local_60.second.m_op = local_80;
  local_78.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
  QStack_70.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
  local_60.second.m_submitted = local_68._0_1_;
  local_60.second.m_insert = local_68._1_1_;
  pVar8 = std::
          _Rb_tree<int,std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>,std::_Select1st<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>,std::less<int>,std::allocator<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>>
          ::_M_insert_unique<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>
                    ((_Rb_tree<int,std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>,std::_Select1st<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>,std::less<int>,std::allocator<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>>
                      *)&pQVar2->m,&local_60);
  _Var6 = pVar8.first._M_node;
  QSqlRecord::~QSqlRecord(&local_60.second.m_db_values);
  QSqlRecord::~QSqlRecord(&local_60.second.m_rec);
  QSqlRecord::~QSqlRecord(&QStack_70);
  QSqlRecord::~QSqlRecord(&local_78);
  QSqlRecord::~QSqlRecord(&local_90);
LAB_0013d8e8:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (ModifiedRow *)&_Var6._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }